

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool_args.cpp
# Opt level: O0

void anon_unknown.dwarf_1d7be5b::ApplyArgsManOptions
               (ArgsManager *argsman,MemPoolLimits *mempool_limits)

{
  bool bVar1;
  int64_t iVar2;
  _Storage<long,_true> this;
  long *plVar3;
  undefined1 uVar4;
  int64_t *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  optional<long> oVar5;
  optional<long> vkb_1;
  optional<long> vkb;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  int64_t in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  ArgsManager *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  allocator<char> local_ac;
  allocator<char> local_ab;
  allocator<char> local_aa;
  allocator<char> local_a9;
  _Storage<long,_true> local_a8;
  undefined1 local_a0;
  _Storage<long,_true> local_98;
  undefined1 local_90;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  iVar2 = ArgsManager::GetIntArg
                    ((ArgsManager *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                     in_stack_fffffffffffffeb8,in_stack_fffffffffffffec8);
  *in_RSI = iVar2;
  std::__cxx11::string::~string(in_stack_fffffffffffffeb8);
  std::allocator<char>::~allocator(&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RDI,(char *)in_stack_ffffffffffffff00,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  oVar5 = ArgsManager::GetIntArg
                    (in_stack_ffffffffffffff00,
                     (string *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  this._M_value =
       oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
       _M_payload;
  uVar4 = oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
          ._M_engaged;
  local_98._M_value = this._M_value;
  local_90 = uVar4;
  std::__cxx11::string::~string(in_stack_fffffffffffffeb8);
  std::allocator<char>::~allocator(&local_aa);
  bVar1 = std::optional::operator_cast_to_bool((optional<long> *)in_stack_fffffffffffffeb8);
  if (bVar1) {
    plVar3 = std::optional<long>::operator*((optional<long> *)in_stack_fffffffffffffeb8);
    in_RSI[1] = *plVar3 * 1000;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RDI,(char *)this,(allocator<char> *)CONCAT17(uVar4,in_stack_fffffffffffffef8));
  iVar2 = ArgsManager::GetIntArg
                    ((ArgsManager *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                     in_stack_fffffffffffffeb8,in_stack_fffffffffffffec8);
  in_RSI[2] = iVar2;
  std::__cxx11::string::~string(in_stack_fffffffffffffeb8);
  std::allocator<char>::~allocator(&local_ab);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RDI,(char *)this,(allocator<char> *)CONCAT17(uVar4,in_stack_fffffffffffffef8));
  oVar5 = ArgsManager::GetIntArg
                    ((ArgsManager *)this,(string *)CONCAT17(uVar4,in_stack_fffffffffffffef8));
  local_a8._M_value =
       oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
       _M_payload;
  local_a0 = oVar5.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_engaged;
  std::__cxx11::string::~string(in_stack_fffffffffffffeb8);
  std::allocator<char>::~allocator(&local_ac);
  bVar1 = std::optional::operator_cast_to_bool((optional<long> *)in_stack_fffffffffffffeb8);
  if (bVar1) {
    plVar3 = std::optional<long>::operator*((optional<long> *)in_stack_fffffffffffffeb8);
    in_RSI[3] = *plVar3 * 1000;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ApplyArgsManOptions(const ArgsManager& argsman, MemPoolLimits& mempool_limits)
{
    mempool_limits.ancestor_count = argsman.GetIntArg("-limitancestorcount", mempool_limits.ancestor_count);

    if (auto vkb = argsman.GetIntArg("-limitancestorsize")) mempool_limits.ancestor_size_vbytes = *vkb * 1'000;

    mempool_limits.descendant_count = argsman.GetIntArg("-limitdescendantcount", mempool_limits.descendant_count);

    if (auto vkb = argsman.GetIntArg("-limitdescendantsize")) mempool_limits.descendant_size_vbytes = *vkb * 1'000;
}